

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

char * FIX::socket_hostname(char *name)

{
  int local_45c;
  char local_458 [4];
  int error;
  char buf [1024];
  undefined1 local_50 [8];
  hostent host;
  in_addr saddr;
  in_addr **paddr;
  hostent *host_ptr;
  char *name_local;
  
  paddr = (in_addr **)0x0;
  host_ptr = (hostent *)name;
  host.h_addr_list._4_4_ = inet_addr(name);
  if (host.h_addr_list._4_4_ == 0xffffffff) {
    gethostbyname_r((char *)host_ptr,(hostent *)local_50,local_458,0x400,(hostent **)&paddr,
                    &local_45c);
    if (paddr == (in_addr **)0x0) {
      name_local = (char *)0x0;
    }
    else {
      name_local = inet_ntoa((in_addr)**(in_addr_t **)paddr[3]);
    }
  }
  else {
    name_local = (char *)host_ptr;
  }
  return name_local;
}

Assistant:

const char *socket_hostname(const char *name) {
  struct hostent *host_ptr = 0;
  struct in_addr **paddr;
  struct in_addr saddr;

#if (GETHOSTBYNAME_R_INPUTS_RESULT || GETHOSTBYNAME_R_RETURNS_RESULT)
  hostent host;
  char buf[1024];
  int error;
#endif

  saddr.s_addr = inet_addr(name);
  if (saddr.s_addr != (unsigned)-1) {
    return name;
  }

#if GETHOSTBYNAME_R_INPUTS_RESULT
  gethostbyname_r(name, &host, buf, sizeof(buf), &host_ptr, &error);
#elif GETHOSTBYNAME_R_RETURNS_RESULT
  host_ptr = gethostbyname_r(name, &host, buf, sizeof(buf), &error);
#else
  host_ptr = gethostbyname(name);
#endif

  if (host_ptr == 0) {
    return 0;
  }

  paddr = (struct in_addr **)host_ptr->h_addr_list;
  return inet_ntoa(**paddr);
}